

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyImage
          (TextureBorderClampTest *this,Surface *renderedFrame,IterationConfig *config,
          ReferenceParams *samplerParams)

{
  RenderTarget *this_00;
  PixelFormat *pPVar1;
  Texture2D *this_01;
  Texture2D *this_02;
  TextureFormat *baseFormat;
  TextureFormat TVar2;
  reference pvVar3;
  byte local_2b4;
  bool local_2b3;
  bool local_2b2;
  bool local_2b1;
  allocator<char> local_291;
  string local_290;
  ConstPixelBufferAccess local_270;
  ConstPixelBufferAccess local_248;
  Vector<int,_3> local_220;
  Vector<int,_3> local_214;
  Vector<int,_3> local_208;
  Vector<int,_3> local_1fc;
  undefined1 local_1f0 [8];
  LodPrecision lowQualityLodPrecision;
  int iStack_1dc;
  TexComparePrecision lowQualityTexComparePrecision;
  int iStack_1b4;
  TexComparePrecision texComparePrecision;
  ConstPixelBufferAccess local_168;
  float local_13c;
  Vector<int,_3> local_138;
  Vector<int,_3> local_12c;
  Vector<float,_4> local_120;
  tcu local_110 [8];
  float afStack_108 [2];
  undefined1 local_100 [8];
  LookupPrecision lookupPrecision;
  Vector<int,_4> local_c4;
  Vector<int,_4> local_b4;
  Vector<int,_4> local_a4;
  undefined1 local_94 [8];
  IVec4 colorBits;
  int colorErrorBits;
  bool isSRGB;
  bool isNearestOnly;
  bool isNearestMagFilter;
  bool isNearestMinFilter;
  TextureFormat texFormat;
  bool local_61;
  undefined1 local_60 [7];
  bool verificationOk;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrecision;
  PixelFormat pixelFormat;
  ReferenceParams *samplerParams_local;
  IterationConfig *config_local;
  Surface *renderedFrame_local;
  TextureBorderClampTest *this_local;
  
  this_00 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar1 = tcu::RenderTarget::getPixelFormat(this_00);
  lodPrecision.derivateBits = pPVar1->redBits;
  lodPrecision.lodBits = pPVar1->greenBits;
  tcu::LodPrecision::LodPrecision
            ((LodPrecision *)
             ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),RULE_OPENGL);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_60,&config->p0,&config->p1);
  lodPrecision.rule = 5;
  if ((samplerParams->sampler).compare == COMPAREMODE_NONE) {
    this_01 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
              operator->(&(this->m_texture).
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
    this_02 = glu::Texture2D::getRefTexture(this_01);
    baseFormat = tcu::TextureLevelPyramid::getFormat(&this_02->super_TextureLevelPyramid);
    TVar2 = tcu::getEffectiveDepthStencilTextureFormat(baseFormat,this->m_sampleMode);
    local_2b1 = true;
    if ((samplerParams->sampler).minFilter != NEAREST) {
      local_2b1 = (samplerParams->sampler).minFilter == NEAREST_MIPMAP_NEAREST;
    }
    colorBits.m_data[3]._3_1_ = local_2b1;
    colorBits.m_data[3]._2_1_ = (samplerParams->sampler).magFilter == NEAREST;
    local_2b2 = local_2b1 != false && (bool)colorBits.m_data[3]._2_1_;
    colorBits.m_data[3]._1_1_ = local_2b2;
    colorErrorBits = TVar2.order;
    local_2b3 = colorErrorBits == 0xe || colorErrorBits == 0xf;
    colorBits.m_data[3]._0_1_ = local_2b3;
    local_2b4 = 0;
    if (local_2b1 != false && (bool)colorBits.m_data[3]._2_1_) {
      local_2b4 = local_2b3 ^ 0xff;
    }
    colorBits.m_data[2] = 2 - (local_2b4 & 1);
    glu::TextureTestUtil::getBitsVec
              ((TextureTestUtil *)&local_b4,(PixelFormat *)&lodPrecision.derivateBits);
    tcu::Vector<int,_4>::Vector(&local_c4,colorBits.m_data[2]);
    tcu::operator-((tcu *)&local_a4,&local_b4,&local_c4);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(lookupPrecision.colorThreshold.m_data + 3),0);
    tcu::max<int,4>((tcu *)local_94,&local_a4,
                    (Vector<int,_4> *)(lookupPrecision.colorThreshold.m_data + 3));
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_100);
    tcu::computeFixedPointThreshold((tcu *)&local_120,(IVec4 *)local_94);
    tcu::operator/(local_110,&local_120,&(samplerParams->super_RenderParams).colorScale);
    lookupPrecision.uvwBits.m_data._4_8_ = local_110;
    lookupPrecision.colorThreshold.m_data[0] = afStack_108[0];
    lookupPrecision.colorThreshold.m_data[1] = afStack_108[1];
    tcu::Vector<int,_3>::Vector(&local_12c,0x14,0x14,0);
    lookupPrecision.coordBits.m_data[0] = local_12c.m_data[2];
    local_100._0_4_ = local_12c.m_data[0];
    local_100._4_4_ = local_12c.m_data[1];
    tcu::Vector<int,_3>::Vector(&local_138,5,5,0);
    lookupPrecision.uvwBits.m_data[0] = local_138.m_data[2];
    lookupPrecision.coordBits.m_data[1] = local_138.m_data[0];
    lookupPrecision.coordBits.m_data[2] = local_138.m_data[1];
    glu::TextureTestUtil::getCompareMask
              ((TextureTestUtil *)&local_13c,(PixelFormat *)&lodPrecision.derivateBits);
    lookupPrecision.colorThreshold.m_data[2] = local_13c;
    if (this->m_samplingFunction == SAMPLE_FILTER) {
      tcu::Surface::getAccess(&local_168,renderedFrame);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_60,0);
      local_61 = verifyTextureSampleResult
                           (this,&local_168,pvVar3,samplerParams,
                            (LodPrecision *)
                            ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (LookupPrecision *)local_100);
    }
    else if (this->m_samplingFunction == SAMPLE_GATHER) {
      tcu::Surface::getAccess
                ((ConstPixelBufferAccess *)&texComparePrecision.resultBits,renderedFrame);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_60,0);
      local_61 = verifyTextureGatherResult
                           (this,(ConstPixelBufferAccess *)&texComparePrecision.resultBits,pvVar3,
                            samplerParams,(LookupPrecision *)local_100);
    }
    else {
      local_61 = false;
    }
  }
  else {
    tcu::TexComparePrecision::TexComparePrecision
              ((TexComparePrecision *)&lowQualityTexComparePrecision.resultBits);
    tcu::TexComparePrecision::TexComparePrecision
              ((TexComparePrecision *)&lowQualityLodPrecision.lodBits);
    lowQualityLodPrecision.rule = lodPrecision.rule;
    local_1f0._4_4_ = 0x12;
    local_1f0._0_4_ =
         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
    tcu::Vector<int,_3>::Vector(&local_1fc,0x14,0x14,0);
    texComparePrecision.coordBits.m_data[0] = local_1fc.m_data[2];
    lowQualityTexComparePrecision.resultBits = local_1fc.m_data[0];
    iStack_1b4 = local_1fc.m_data[1];
    tcu::Vector<int,_3>::Vector(&local_208,7,7,0);
    texComparePrecision.uvwBits.m_data[0] = local_208.m_data[2];
    texComparePrecision.coordBits.m_data[1] = local_208.m_data[0];
    texComparePrecision.coordBits.m_data[2] = local_208.m_data[1];
    texComparePrecision.uvwBits.m_data[1] = 5;
    texComparePrecision.uvwBits.m_data[2] = 0x10;
    texComparePrecision.pcfBits = de::max<int>(0,lodPrecision.derivateBits + -1);
    tcu::Vector<int,_3>::Vector(&local_214,0x14,0x14,0);
    lowQualityTexComparePrecision.coordBits.m_data[0] = local_214.m_data[2];
    lowQualityLodPrecision.lodBits = local_214.m_data[0];
    iStack_1dc = local_214.m_data[1];
    tcu::Vector<int,_3>::Vector(&local_220,4,4,0);
    lowQualityTexComparePrecision.uvwBits.m_data[0] = local_220.m_data[2];
    lowQualityTexComparePrecision.coordBits.m_data[1] = local_220.m_data[0];
    lowQualityTexComparePrecision.coordBits.m_data[2] = local_220.m_data[1];
    lowQualityTexComparePrecision.uvwBits.m_data[1] = 0;
    lowQualityTexComparePrecision.uvwBits.m_data[2] = 0x10;
    lowQualityTexComparePrecision.pcfBits = de::max<int>(0,lodPrecision.derivateBits + -1);
    lowQualityLodPrecision.rule = 4;
    if (this->m_samplingFunction == SAMPLE_FILTER) {
      tcu::Surface::getAccess(&local_248,renderedFrame);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_60,0);
      local_61 = verifyTextureCompareResult
                           (this,&local_248,pvVar3,samplerParams,
                            (TexComparePrecision *)&lowQualityTexComparePrecision.resultBits,
                            (TexComparePrecision *)&lowQualityLodPrecision.lodBits,
                            (LodPrecision *)
                            ((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (LodPrecision *)local_1f0);
    }
    else if (this->m_samplingFunction == SAMPLE_GATHER) {
      tcu::Surface::getAccess(&local_270,renderedFrame);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_60,0);
      local_61 = verifyTextureGatherCmpResult
                           (this,&local_270,pvVar3,samplerParams,
                            (TexComparePrecision *)&lowQualityTexComparePrecision.resultBits,
                            (TexComparePrecision *)&lowQualityLodPrecision.lodBits);
    }
    else {
      local_61 = false;
    }
  }
  if (local_61 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"Image verification failed",&local_291);
    tcu::ResultCollector::fail(&this->m_result,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  return;
}

Assistant:

void TextureBorderClampTest::verifyImage (const tcu::Surface&							renderedFrame,
										  const IterationConfig&						config,
										  const glu::TextureTestUtil::ReferenceParams&	samplerParams)
{
	const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();

	tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
	std::vector<float>		texCoord;
	bool					verificationOk;

	glu::TextureTestUtil::computeQuadTexCoord2D(texCoord, config.p0, config.p1);

	lodPrecision.derivateBits		= 18;
	lodPrecision.lodBits			= 5;

	if (samplerParams.sampler.compare == tcu::Sampler::COMPAREMODE_NONE)
	{
		const tcu::TextureFormat		texFormat			= tcu::getEffectiveDepthStencilTextureFormat(m_texture->getRefTexture().getFormat(), m_sampleMode);
		const bool						isNearestMinFilter	= samplerParams.sampler.minFilter == tcu::Sampler::NEAREST || samplerParams.sampler.minFilter == tcu::Sampler::NEAREST_MIPMAP_NEAREST;
		const bool						isNearestMagFilter	= samplerParams.sampler.magFilter == tcu::Sampler::NEAREST;
		const bool						isNearestOnly		= isNearestMinFilter && isNearestMagFilter;
		const bool						isSRGB				= texFormat.order == tcu::TextureFormat::sRGB || texFormat.order == tcu::TextureFormat::sRGBA;
		const int						colorErrorBits		= (isNearestOnly && !isSRGB) ? (1) : (2);
		const tcu::IVec4				colorBits			= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - tcu::IVec4(colorErrorBits), tcu::IVec4(0));
		tcu::LookupPrecision			lookupPrecision;

		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / samplerParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,0);
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureSampleResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lodPrecision,
													   lookupPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lookupPrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}
	else
	{
		tcu::TexComparePrecision	texComparePrecision;
		tcu::TexComparePrecision	lowQualityTexComparePrecision;
		tcu::LodPrecision			lowQualityLodPrecision			= lodPrecision;

		texComparePrecision.coordBits					= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits						= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits						= 5;
		texComparePrecision.referenceBits				= 16;
		texComparePrecision.resultBits					= de::max(0, pixelFormat.redBits - 1);

		lowQualityTexComparePrecision.coordBits			= tcu::IVec3(20,20,0);
		lowQualityTexComparePrecision.uvwBits			= tcu::IVec3(4,4,0);
		lowQualityTexComparePrecision.pcfBits			= 0;
		lowQualityTexComparePrecision.referenceBits		= 16;
		lowQualityTexComparePrecision.resultBits		= de::max(0, pixelFormat.redBits - 1);

		lowQualityLodPrecision.lodBits					= 4;

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureCompareResult(renderedFrame.getAccess(),
														&texCoord[0],
														samplerParams,
														texComparePrecision,
														lowQualityTexComparePrecision,
														lodPrecision,
														lowQualityLodPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherCmpResult(renderedFrame.getAccess(),
														  &texCoord[0],
														  samplerParams,
														  texComparePrecision,
														  lowQualityTexComparePrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}

	if (!verificationOk)
		m_result.fail("Image verification failed");
}